

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncResult.h
# Opt level: O3

optional<int> __thiscall
nrg::AsyncResult<int>::Impl::getResult<long,std::ratio<1l,1000l>>
          (Impl *this,duration<long,_std::ratio<1L,_1000L>_> *timeout)

{
  duration<long,_std::ratio<1L,_1000L>_> *in_RDX;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_30;
  
  local_30._M_owns = false;
  local_30._M_device = (mutex_type *)timeout;
  std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  if (*(char *)((long)&timeout[0xb].__r + 4) != '\x01') {
    std::condition_variable::
    wait_for<long,std::ratio<1l,1000l>,nrg::AsyncResult<int>::Impl::getResult<long,std::ratio<1l,1000l>>(std::chrono::duration<long,std::ratio<1l,1000l>>const&)const::_lambda()_1_>
              ((condition_variable *)(timeout + 5),&local_30,in_RDX,(anon_class_8_1_8991fb9c)timeout
              );
    (this->guard_).super___mutex_base._M_mutex.__size[4] = '\0';
    if (*(char *)((long)&timeout[0xb].__r + 4) != '\x01') goto LAB_0011df23;
  }
  (this->guard_).super___mutex_base._M_mutex.__data.__lock = (int)timeout[0xb].__r;
  (this->guard_).super___mutex_base._M_mutex.__size[4] = '\x01';
LAB_0011df23:
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return (optional<int>)(_Optional_base<int,_false>)this;
}

Assistant:

std::experimental::optional<R> getResult(const std::chrono::duration<Rep, Period>& timeout) const
        {
            std::unique_lock<std::mutex> lock(guard_);
            if (result_) {
                return result_;
            }

            cond_.wait_for(lock, timeout, [this]() { return static_cast<bool>(result_); });
            return result_;
        }